

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall QDomDocumentPrivate::QDomDocumentPrivate(QDomDocumentPrivate *this)

{
  QAtomicInt *pQVar1;
  QDomDocumentTypePrivate *pQVar2;
  QArrayData *pQVar3;
  QDomImplementationPrivate *pQVar4;
  QDomDocumentTypePrivate *this_00;
  EVP_PKEY_CTX *in_RSI;
  
  (this->super_QDomNodePrivate).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 1;
  (this->super_QDomNodePrivate).name.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).name.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).name.d.size = 0;
  (this->super_QDomNodePrivate).value.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).value.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).value.d.size = 0;
  (this->super_QDomNodePrivate).prefix.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).prefix.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).prefix.d.size = 0;
  (this->super_QDomNodePrivate).namespaceURI.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).namespaceURI.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).namespaceURI.d.size = 0;
  (this->super_QDomNodePrivate).ownerNode = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).prev = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).next = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).first = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).last = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).field_0x98 = ((this->super_QDomNodePrivate).field_0x98 & 0xfc) + 1;
  (this->super_QDomNodePrivate).lineNumber = -1;
  (this->super_QDomNodePrivate).columnNumber = -1;
  (this->super_QDomNodePrivate)._vptr_QDomNodePrivate =
       (_func_int **)&PTR__QDomDocumentPrivate_00129620;
  pQVar4 = (QDomImplementationPrivate *)operator_new(4);
  (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  (this->impl).d.ptr = pQVar4;
  LOCK();
  (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (this->type).d.ptr = (QDomDocumentTypePrivate *)0x0;
  this->nodeListTime = 1;
  this_00 = (QDomDocumentTypePrivate *)operator_new(0x100);
  (this_00->super_QDomNodePrivate).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 1;
  (this_00->super_QDomNodePrivate).name.d.d = (Data *)0x0;
  (this_00->super_QDomNodePrivate).name.d.ptr = (char16_t *)0x0;
  (this_00->super_QDomNodePrivate).name.d.size = 0;
  (this_00->super_QDomNodePrivate).value.d.d = (Data *)0x0;
  (this_00->super_QDomNodePrivate).value.d.ptr = (char16_t *)0x0;
  (this_00->super_QDomNodePrivate).value.d.size = 0;
  (this_00->super_QDomNodePrivate).prefix.d.d = (Data *)0x0;
  (this_00->super_QDomNodePrivate).prefix.d.ptr = (char16_t *)0x0;
  (this_00->super_QDomNodePrivate).prefix.d.size = 0;
  (this_00->super_QDomNodePrivate).namespaceURI.d.d = (Data *)0x0;
  (this_00->super_QDomNodePrivate).namespaceURI.d.ptr = (char16_t *)0x0;
  (this_00->super_QDomNodePrivate).namespaceURI.d.size = 0;
  (this_00->super_QDomNodePrivate).ownerNode = &this->super_QDomNodePrivate;
  (this_00->super_QDomNodePrivate).prev = (QDomNodePrivate *)0x0;
  (this_00->super_QDomNodePrivate).next = (QDomNodePrivate *)0x0;
  (this_00->super_QDomNodePrivate).first = (QDomNodePrivate *)0x0;
  (this_00->super_QDomNodePrivate).last = (QDomNodePrivate *)0x0;
  (this_00->super_QDomNodePrivate).field_0x98 = 0xff;
  (this_00->super_QDomNodePrivate).lineNumber = -1;
  (this_00->super_QDomNodePrivate).columnNumber = -1;
  (this_00->super_QDomNodePrivate)._vptr_QDomNodePrivate =
       (_func_int **)&PTR__QDomDocumentTypePrivate_00129020;
  (this_00->publicId).d.d = (Data *)0x0;
  (this_00->publicId).d.ptr = (char16_t *)0x0;
  (this_00->publicId).d.size = 0;
  (this_00->systemId).d.d = (Data *)0x0;
  (this_00->systemId).d.ptr = (char16_t *)0x0;
  (this_00->systemId).d.size = 0;
  (this_00->internalSubset).d.d = (Data *)0x0;
  (this_00->internalSubset).d.ptr = (char16_t *)0x0;
  (this_00->internalSubset).d.size = 0;
  QDomDocumentTypePrivate::init(this_00,in_RSI);
  if ((this->type).d.ptr != this_00) {
    LOCK();
    pQVar1 = &(this_00->super_QDomNodePrivate).ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar2 = (this->type).d.ptr;
    (this->type).d.ptr = this_00;
    if (pQVar2 != (QDomDocumentTypePrivate *)0x0) {
      LOCK();
      pQVar1 = &(pQVar2->super_QDomNodePrivate).ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*(pQVar2->super_QDomNodePrivate)._vptr_QDomNodePrivate[1])();
      }
    }
  }
  LOCK();
  pQVar1 = &(((this->type).d.ptr)->super_QDomNodePrivate).ref;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  pQVar3 = &((this->super_QDomNodePrivate).name.d.d)->super_QArrayData;
  (this->super_QDomNodePrivate).name.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).name.d.ptr = L"#document";
  (this->super_QDomNodePrivate).name.d.size = 9;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QDomDocumentPrivate::QDomDocumentPrivate()
    : QDomNodePrivate(nullptr),
      impl(new QDomImplementationPrivate),
      nodeListTime(1)
{
    type = new QDomDocumentTypePrivate(this, this);
    type->ref.deref();

    name = u"#document"_s;
}